

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

bool __thiscall
node::BlockManager::UndoWriteToDisk
          (BlockManager *this,CBlockUndo *blockundo,FlatFilePos *pos,uint256 *hashBlock)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  bool bVar4;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  char *in_stack_ffffffffffffff20;
  AutoFile fileout;
  base_blob<256U> local_b8;
  HashWriter hasher;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  OpenUndoFile(&fileout,this,pos,false);
  if (fileout.m_file == (FILE *)0x0) {
    logging_function._M_str = "UndoWriteToDisk";
    logging_function._M_len = 0xf;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file._M_len = 0x5e;
    LogPrintf_<char[16]>
              (logging_function,source_file,0x2a5,
               I2P|VALIDATION|QT|LIBEVENT|CMPCTBLOCK|REINDEX|SELECTCOINS|ADDRMAN|BENCH|MEMPOOL|TOR|
               NET,0x6a1e07,in_stack_ffffffffffffff20,(char (*) [16])0x0);
  }
  else {
    sVar2 = GetSerializeSize<CBlockUndo>(blockundo);
    Serialize<AutoFile,_unsigned_char,_4UL>(&fileout,&((this->m_opts).chainparams)->pchMessageStart)
    ;
    ser_writedata32<AutoFile>(&fileout,(uint32_t)sVar2);
    lVar3 = ftell((FILE *)fileout.m_file);
    if (-1 < lVar3) {
      pos->nPos = (uint)lVar3;
      Serialize<AutoFile,CTxUndo,std::allocator<CTxUndo>>(&fileout,&blockundo->vtxundo);
      hasher.ctx.buf[0x30] = '\0';
      hasher.ctx.buf[0x31] = '\0';
      hasher.ctx.buf[0x32] = '\0';
      hasher.ctx.buf[0x33] = '\0';
      hasher.ctx.buf[0x34] = '\0';
      hasher.ctx.buf[0x35] = '\0';
      hasher.ctx.buf[0x36] = '\0';
      hasher.ctx.buf[0x37] = '\0';
      hasher.ctx.buf[0x38] = '\0';
      hasher.ctx.buf[0x39] = '\0';
      hasher.ctx.buf[0x3a] = '\0';
      hasher.ctx.buf[0x3b] = '\0';
      hasher.ctx.buf[0x3c] = '\0';
      hasher.ctx.buf[0x3d] = '\0';
      hasher.ctx.buf[0x3e] = '\0';
      hasher.ctx.buf[0x3f] = '\0';
      hasher.ctx.buf[0x20] = '\0';
      hasher.ctx.buf[0x21] = '\0';
      hasher.ctx.buf[0x22] = '\0';
      hasher.ctx.buf[0x23] = '\0';
      hasher.ctx.buf[0x24] = '\0';
      hasher.ctx.buf[0x25] = '\0';
      hasher.ctx.buf[0x26] = '\0';
      hasher.ctx.buf[0x27] = '\0';
      hasher.ctx.buf[0x28] = '\0';
      hasher.ctx.buf[0x29] = '\0';
      hasher.ctx.buf[0x2a] = '\0';
      hasher.ctx.buf[0x2b] = '\0';
      hasher.ctx.buf[0x2c] = '\0';
      hasher.ctx.buf[0x2d] = '\0';
      hasher.ctx.buf[0x2e] = '\0';
      hasher.ctx.buf[0x2f] = '\0';
      hasher.ctx.buf[0x10] = '\0';
      hasher.ctx.buf[0x11] = '\0';
      hasher.ctx.buf[0x12] = '\0';
      hasher.ctx.buf[0x13] = '\0';
      hasher.ctx.buf[0x14] = '\0';
      hasher.ctx.buf[0x15] = '\0';
      hasher.ctx.buf[0x16] = '\0';
      hasher.ctx.buf[0x17] = '\0';
      hasher.ctx.buf[0x18] = '\0';
      hasher.ctx.buf[0x19] = '\0';
      hasher.ctx.buf[0x1a] = '\0';
      hasher.ctx.buf[0x1b] = '\0';
      hasher.ctx.buf[0x1c] = '\0';
      hasher.ctx.buf[0x1d] = '\0';
      hasher.ctx.buf[0x1e] = '\0';
      hasher.ctx.buf[0x1f] = '\0';
      hasher.ctx.buf[0] = '\0';
      hasher.ctx.buf[1] = '\0';
      hasher.ctx.buf[2] = '\0';
      hasher.ctx.buf[3] = '\0';
      hasher.ctx.buf[4] = '\0';
      hasher.ctx.buf[5] = '\0';
      hasher.ctx.buf[6] = '\0';
      hasher.ctx.buf[7] = '\0';
      hasher.ctx.buf[8] = '\0';
      hasher.ctx.buf[9] = '\0';
      hasher.ctx.buf[10] = '\0';
      hasher.ctx.buf[0xb] = '\0';
      hasher.ctx.buf[0xc] = '\0';
      hasher.ctx.buf[0xd] = '\0';
      hasher.ctx.buf[0xe] = '\0';
      hasher.ctx.buf[0xf] = '\0';
      hasher.ctx.s[4] = 0;
      hasher.ctx.s[5] = 0;
      hasher.ctx.s[6] = 0;
      hasher.ctx.s[7] = 0;
      hasher.ctx.s[0] = 0;
      hasher.ctx.s[1] = 0;
      hasher.ctx.s[2] = 0;
      hasher.ctx.s[3] = 0;
      hasher.ctx.bytes = 0;
      CSHA256::CSHA256(&hasher.ctx);
      base_blob<256U>::Serialize<HashWriter>(&hashBlock->super_base_blob<256U>,&hasher);
      Serialize<HashWriter,CTxUndo,std::allocator<CTxUndo>>(&hasher,&blockundo->vtxundo);
      HashWriter::GetHash((uint256 *)&local_b8,&hasher);
      base_blob<256U>::Serialize<AutoFile>(&local_b8,&fileout);
      bVar4 = true;
      goto LAB_001df3fc;
    }
    logging_function_00._M_str = "UndoWriteToDisk";
    logging_function_00._M_len = 0xf;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file_00._M_len = 0x5e;
    LogPrintf_<char[16]>
              (logging_function_00,source_file_00,0x2b0,
               I2P|VALIDATION|QT|LIBEVENT|CMPCTBLOCK|REINDEX|SELECTCOINS|ADDRMAN|ZMQ|BENCH,0x6a1e07,
               in_stack_ffffffffffffff20,(char (*) [16])fileout.m_file);
  }
  bVar4 = false;
LAB_001df3fc:
  AutoFile::~AutoFile(&fileout);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::UndoWriteToDisk(const CBlockUndo& blockundo, FlatFilePos& pos, const uint256& hashBlock) const
{
    // Open history file to append
    AutoFile fileout{OpenUndoFile(pos)};
    if (fileout.IsNull()) {
        LogError("%s: OpenUndoFile failed\n", __func__);
        return false;
    }

    // Write index header
    unsigned int nSize = GetSerializeSize(blockundo);
    fileout << GetParams().MessageStart() << nSize;

    // Write undo data
    long fileOutPos = ftell(fileout.Get());
    if (fileOutPos < 0) {
        LogError("%s: ftell failed\n", __func__);
        return false;
    }
    pos.nPos = (unsigned int)fileOutPos;
    fileout << blockundo;

    // calculate & write checksum
    HashWriter hasher{};
    hasher << hashBlock;
    hasher << blockundo;
    fileout << hasher.GetHash();

    return true;
}